

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jchuff.c
# Opt level: O0

boolean encode_mcu_huff(j_compress_ptr cinfo,JBLOCKROW *MCU_data)

{
  int iVar1;
  boolean bVar2;
  jpeg_component_info *compptr;
  int ci;
  int blkn;
  working_state state;
  huff_entropy_ptr_conflict entropy;
  JBLOCKROW *MCU_data_local;
  j_compress_ptr cinfo_local;
  
  state.cinfo = (j_compress_ptr)cinfo->entropy;
  _ci = cinfo->dest->next_output_byte;
  state.next_output_byte = (JOCTET *)cinfo->dest->free_in_buffer;
  state.free_in_buffer = (size_t)(state.cinfo)->client_data;
  state.cur.put_buffer._0_4_ = (state.cinfo)->is_decompressor;
  state.cur.put_buffer._4_4_ = (state.cinfo)->global_state;
  state.cur._8_8_ = (state.cinfo)->dest;
  state.cur.last_dc_val[1] = (state.cinfo)->image_width;
  state.cur.last_dc_val[2] = (state.cinfo)->image_height;
  state.cur._24_8_ = cinfo;
  if (((cinfo->restart_interval == 0) || ((state.cinfo)->input_components != 0)) ||
     (bVar2 = emit_restart_s((working_state *)&ci,(state.cinfo)->in_color_space), bVar2 != 0)) {
    for (compptr._4_4_ = 0; compptr._4_4_ < cinfo->blocks_in_MCU; compptr._4_4_ = compptr._4_4_ + 1)
    {
      iVar1 = cinfo->MCU_membership[compptr._4_4_];
      bVar2 = encode_one_block((working_state *)&ci,*MCU_data[compptr._4_4_],
                               state.cur.last_dc_val[(long)iVar1 + -2],
                               (c_derived_tbl *)
                               (state.cinfo)->quant_tbl_ptrs
                               [(long)cinfo->cur_comp_info[iVar1]->dc_tbl_no + -6],
                               (c_derived_tbl *)
                               (state.cinfo)->quant_tbl_ptrs
                               [(long)cinfo->cur_comp_info[iVar1]->ac_tbl_no + -2]);
      if (bVar2 == 0) {
        return 0;
      }
      state.cur.last_dc_val[(long)iVar1 + -2] = (int)(*MCU_data[compptr._4_4_])[0];
    }
    cinfo->dest->next_output_byte = _ci;
    cinfo->dest->free_in_buffer = (size_t)state.next_output_byte;
    (state.cinfo)->client_data = (void *)state.free_in_buffer;
    (state.cinfo)->is_decompressor = (undefined4)state.cur.put_buffer;
    (state.cinfo)->global_state = state.cur.put_buffer._4_4_;
    (state.cinfo)->dest = (jpeg_destination_mgr *)state.cur._8_8_;
    (state.cinfo)->image_width = state.cur.last_dc_val[1];
    (state.cinfo)->image_height = state.cur.last_dc_val[2];
    if (cinfo->restart_interval != 0) {
      if ((state.cinfo)->input_components == 0) {
        (state.cinfo)->input_components = cinfo->restart_interval;
        (state.cinfo)->in_color_space = (state.cinfo)->in_color_space + JCS_GRAYSCALE;
        (state.cinfo)->in_color_space = (state.cinfo)->in_color_space & (JCS_CMYK|JCS_YCbCr);
      }
      (state.cinfo)->input_components = (state.cinfo)->input_components + -1;
    }
    cinfo_local._4_4_ = 1;
  }
  else {
    cinfo_local._4_4_ = 0;
  }
  return cinfo_local._4_4_;
}

Assistant:

METHODDEF(boolean)
encode_mcu_huff (j_compress_ptr cinfo, JBLOCKROW *MCU_data)
{
  huff_entropy_ptr entropy = (huff_entropy_ptr) cinfo->entropy;
  working_state state;
  int blkn, ci;
  jpeg_component_info * compptr;

  /* Load up working state */
  state.next_output_byte = cinfo->dest->next_output_byte;
  state.free_in_buffer = cinfo->dest->free_in_buffer;
  ASSIGN_STATE(state.cur, entropy->saved);
  state.cinfo = cinfo;

  /* Emit restart marker if needed */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0)
      if (! emit_restart_s(&state, entropy->next_restart_num))
	return FALSE;
  }

  /* Encode the MCU data blocks */
  for (blkn = 0; blkn < cinfo->blocks_in_MCU; blkn++) {
    ci = cinfo->MCU_membership[blkn];
    compptr = cinfo->cur_comp_info[ci];
    if (! encode_one_block(&state,
			   MCU_data[blkn][0], state.cur.last_dc_val[ci],
			   entropy->dc_derived_tbls[compptr->dc_tbl_no],
			   entropy->ac_derived_tbls[compptr->ac_tbl_no]))
      return FALSE;
    /* Update last_dc_val */
    state.cur.last_dc_val[ci] = MCU_data[blkn][0][0];
  }

  /* Completed MCU, so update state */
  cinfo->dest->next_output_byte = state.next_output_byte;
  cinfo->dest->free_in_buffer = state.free_in_buffer;
  ASSIGN_STATE(entropy->saved, state.cur);

  /* Update restart-interval state too */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0) {
      entropy->restarts_to_go = cinfo->restart_interval;
      entropy->next_restart_num++;
      entropy->next_restart_num &= 7;
    }
    entropy->restarts_to_go--;
  }

  return TRUE;
}